

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O1

ostream * absl::lts_20250127::operator<<(ostream *os,Status *x)

{
  StatusToStringMode in_ECX;
  string local_28;
  
  if ((Status *)x->rep_ == (Status *)0x1) {
    local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
    local_28.field_2._M_allocated_capacity._0_2_ = 0x4b4f;
    local_28._M_string_length = 2;
    local_28.field_2._M_local_buf[2] = '\0';
  }
  else {
    Status::ToStringSlow_abi_cxx11_(&local_28,(Status *)x->rep_,0xffffffff,in_ECX);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (os,local_28._M_dataplus._M_p,local_28._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,
                    CONCAT53(local_28.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_28.field_2._M_local_buf[2],
                                      local_28.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Status& x) {
  os << x.ToString(StatusToStringMode::kWithEverything);
  return os;
}